

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,int>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  Variable<float> *pVVar4;
  pointer pcVar5;
  Variable<int> *pVVar6;
  _func_int **pp_Var7;
  FloatFormat *this_00;
  bool bVar8;
  bool bVar9;
  ContextType type;
  int iVar10;
  uint uVar11;
  undefined8 uVar12;
  char *__s;
  size_t sVar13;
  long *plVar14;
  ShaderExecutor *pSVar15;
  IVal *pIVar16;
  IVal *x;
  TestError *this_01;
  TestLog *pTVar17;
  size_t sVar18;
  IVal IVar19;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_>
  *pVVar20;
  long lVar21;
  ulong uVar22;
  PrecisionCase *pPVar23;
  double dVar24;
  double dVar25;
  IVal in1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  ostringstream os;
  Environment env;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_> outputs;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_528;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_>
  *local_520;
  string local_518;
  undefined1 local_4f8 [8];
  undefined8 local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4e8;
  _Rb_tree_node_base *local_4d8;
  size_t local_4d0;
  Statement *local_4c8;
  size_t local_4c0;
  ulong local_4b8;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4b0;
  IVal local_4a8;
  ResultCollector *local_490;
  IVal local_488;
  undefined1 local_468 [8];
  undefined1 auStack_460 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_458;
  double local_448;
  Data local_440;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2e8;
  FloatFormat local_2b8;
  ulong local_290;
  FloatFormat *local_288;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_> local_280;
  undefined1 local_250 [56];
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [3];
  ios_base local_168 [272];
  double local_58;
  undefined8 uStack_50;
  _func_int **local_48;
  undefined8 uStack_40;
  
  pfVar2 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar18 = (long)pfVar3 - (long)pfVar2 >> 2;
  local_520 = variables;
  local_4c8 = stmt;
  local_4b0 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_int>_>::Outputs(&local_280,sVar18);
  local_218._M_p = (pointer)&local_208;
  local_250._0_4_ = GLSL_VERSION_300_ES;
  local_250._8_8_ = (pointer)0x0;
  local_250._16_8_ = (pointer)0x0;
  local_250._24_8_ = (pointer)0x0;
  local_250._32_8_ = (pointer)0x0;
  local_250._40_8_ = (pointer)0x0;
  local_250._48_8_ = (pointer)0x0;
  local_210 = 0;
  local_208._M_local_buf[0] = '\0';
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_528 = this;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"Statement: ",0xb);
  (*local_4c8->_vptr_Statement[2])(local_4c8,(ostringstream *)auStack_460);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  local_4f0 = (double)((ulong)local_4f0._4_4_ << 0x20);
  aStack_4e8._M_allocated_capacity = 0;
  local_4d0 = 0;
  aStack_4e8._8_8_ = (_Rb_tree_node_base *)&local_4f0;
  local_4d8 = (_Rb_tree_node_base *)&local_4f0;
  local_4c0 = sVar18;
  (*local_4c8->_vptr_Statement[4])(local_4c8,local_4f8);
  if ((_Rb_tree_node_base *)aStack_4e8._8_8_ != (_Rb_tree_node_base *)&local_4f0) {
    uVar12 = aStack_4e8._8_8_;
    do {
      (**(code **)(**(long **)(uVar12 + 0x20) + 0x30))(*(long **)(uVar12 + 0x20),local_1d8);
      uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
    } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&local_4f0);
  }
  if (local_4d0 != 0) {
    local_468 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_460,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_460,local_518._M_dataplus._M_p,local_518._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
  pPVar23 = local_528;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,"precision ",10);
  __s = glu::getPrecisionName((pPVar23->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_528 + (long)((TestLog *)((long)local_468 + -0x18))->m_log) +
                    0xc0);
  }
  else {
    sVar13 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,__s,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_218,(string *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p,local_1d8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
  std::ios_base::~ios_base(local_3f8);
  pPVar23 = local_528;
  type.super_ApiType.m_bits =
       (ApiType)(*((local_528->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_250._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((pPVar23->m_extension)._M_string_length != 0) {
    std::operator+(local_1d8,"#extension ",&pPVar23->m_extension);
    plVar14 = (long *)std::__cxx11::string::append((char *)local_1d8);
    pTVar17 = (TestLog *)(plVar14 + 2);
    if ((TestLog *)*plVar14 == pTVar17) {
      aStack_458._M_allocated_capacity = (size_type)pTVar17->m_log;
      aStack_458._8_8_ = plVar14[3];
      local_468 = (undefined1  [8])(auStack_460 + 8);
    }
    else {
      aStack_458._M_allocated_capacity = (size_type)pTVar17->m_log;
      local_468 = (undefined1  [8])*plVar14;
    }
    auStack_460 = (undefined1  [8])plVar14[1];
    *plVar14 = (long)pTVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_218,(string *)local_468);
    if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
      operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
    }
    pPVar23 = local_528;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
      operator_delete(local_1d8[0]._M_dataplus._M_p,local_1d8[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_250 + 8),1);
  makeSymbol<float>((Symbol *)local_468,pPVar23,
                    (local_520->in0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_250._8_8_;
  std::__cxx11::string::operator=((string *)local_250._8_8_,(string *)local_468);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
    operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_250 + 0x20),2);
  makeSymbol<int>((Symbol *)local_468,local_528,
                  (local_520->out1).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<int>_>.m_ptr);
  uVar12 = local_250._32_8_;
  std::__cxx11::string::operator=((string *)(local_250._32_8_ + 0x38),(string *)local_468);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x38))->varType,(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  pPVar23 = local_528;
  if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
    operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
  }
  makeSymbol<float>((Symbol *)local_468,pPVar23,
                    (local_520->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_250._32_8_;
  std::__cxx11::string::operator=((string *)local_250._32_8_,(string *)local_468);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
    operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
  (*local_4c8->_vptr_Statement[2])(local_4c8,local_468);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
  std::ios_base::~ios_base(local_3f8);
  std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p,local_1d8[0].field_2._M_allocated_capacity + 1);
  }
  pPVar23 = local_528;
  pSVar15 = ShaderExecUtil::createExecutor
                      ((local_528->m_ctx).renderContext,(local_528->m_ctx).shaderType,
                       (ShaderSpec *)local_250);
  sVar18 = local_4c0;
  local_468 = (undefined1  [8])
              (local_4b0->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  auStack_460 = (undefined1  [8])
                (local_4b0->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  aStack_458._M_allocated_capacity =
       (size_type)
       (local_4b0->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_458._8_8_ =
       (local_4b0->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1d8[0]._M_dataplus._M_p =
       (pointer)local_280.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1d8[0]._M_string_length =
       (size_type)
       local_280.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (*pSVar15->_vptr_ShaderExecutor[3])
            (pSVar15,((pPVar23->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar10 = (*pSVar15->_vptr_ShaderExecutor[2])(pSVar15);
  if ((char)iVar10 == '\0') {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar15->_vptr_ShaderExecutor[5])(pSVar15);
  (*pSVar15->_vptr_ShaderExecutor[6])(pSVar15,sVar18 & 0xffffffff,local_468,local_1d8);
  (*pSVar15->_vptr_ShaderExecutor[1])(pSVar15);
  pVVar20 = local_520;
  local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
  auStack_460 = (undefined1  [8])0x7ff0000000000000;
  aStack_458._M_allocated_capacity = 0xfff0000000000000;
  local_1d8[0]._M_dataplus._M_p = local_1d8[0]._M_dataplus._M_p & 0xffffffffffffff00;
  local_1d8[0]._M_string_length = 0x7ff0000000000000;
  local_1d8[0].field_2._M_allocated_capacity = -INFINITY;
  local_4f8[0] = false;
  local_4f0 = INFINITY;
  aStack_4e8._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_2e8,
             (local_520->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e8,
             (pVVar20->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_518);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e8,
             (pVVar20->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e8,
             (pVVar20->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_488);
  Environment::bind<float>
            ((Environment *)&local_2e8,
             (pVVar20->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_1d8);
  Environment::bind<int>
            ((Environment *)&local_2e8,
             (pVVar20->out1).super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<int>_>
             .m_ptr,(IVal *)local_4f8);
  if (pfVar3 == pfVar2) {
LAB_017d7cd7:
    local_468 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_288 = &(local_528->m_ctx).floatFormat;
    local_490 = &local_528->m_status;
    local_290 = sVar18 + (sVar18 == 0);
    lVar21 = 0;
    uVar22 = 0;
    local_4b8 = 0;
    pVVar20 = local_520;
    do {
      local_4a8._0_8_ = local_4a8._0_8_ & 0xffffffffffffff00;
      local_4a8.m_lo = INFINITY;
      local_4a8.m_hi = -INFINITY;
      local_488._0_8_ = local_488._0_8_ & 0xffffffffffffff00;
      local_488.m_lo = INFINITY;
      local_488.m_hi = -INFINITY;
      if ((uVar22 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_528->super_TestCase).super_TestNode.m_testCtx);
      }
      this_00 = local_288;
      fVar1 = (local_4b0->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22];
      pp_Var7 = (_func_int **)(double)fVar1;
      bVar8 = NAN(fVar1);
      local_468[0] = bVar8;
      auStack_460 = (undefined1  [8])(_func_int **)0x7ff0000000000000;
      if (!bVar8) {
        auStack_460 = (undefined1  [8])pp_Var7;
      }
      aStack_458._M_allocated_capacity = (size_type)(_func_int **)0xfff0000000000000;
      if (!bVar8) {
        aStack_458._M_allocated_capacity = (size_type)pp_Var7;
      }
      tcu::FloatFormat::roundOut((Interval *)local_4f8,local_288,(Interval *)local_468,false);
      tcu::FloatFormat::convert((Interval *)local_1d8,this_00,(Interval *)local_4f8);
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2e8,
                           (pVVar20->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar16->m_hi = (double)local_1d8[0].field_2._0_8_;
      *(pointer *)pIVar16 = local_1d8[0]._M_dataplus._M_p;
      pIVar16->m_lo = (double)local_1d8[0]._M_string_length;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e8,
                 (pVVar20->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e8,
                 (pVVar20->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e8,
                 (pVVar20->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_440.basic.type = (local_528->m_ctx).precision;
      local_448 = this_00->m_maxValue;
      local_468 = *(undefined1 (*) [8])this_00;
      auStack_460 = *(undefined1 (*) [8])&this_00->m_fractionBits;
      aStack_458._M_allocated_capacity = *(undefined8 *)&this_00->m_hasInf;
      aStack_458._8_8_ = *(undefined8 *)&this_00->m_exactPrecision;
      local_430 = 0;
      local_440._8_8_ = &local_2e8;
      (*local_4c8->_vptr_Statement[3])(local_4c8,(MessageBuilder *)local_468);
      x = Environment::lookup<int>
                    ((Environment *)&local_2e8,
                     (pVVar20->out1).
                     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<int>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_468,&local_2b8,x);
      local_488.m_hi = (double)aStack_458._M_allocated_capacity;
      local_488._0_8_ = local_468;
      local_488.m_lo = (double)auStack_460;
      iVar10 = local_280.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar22];
      local_48 = (_func_int **)auStack_460;
      uStack_40 = 0;
      local_58 = (double)aStack_458._M_allocated_capacity;
      uStack_50 = 0;
      local_468 = (undefined1  [8])(auStack_460 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 1 is outside acceptable range","");
      bVar8 = tcu::ResultCollector::check
                        (local_490,
                         (bool)(-((double)iVar10 <= local_58) &
                                -((double)local_48 <= (double)iVar10) & 1),(string *)local_468);
      pVVar20 = local_520;
      if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
        operator_delete((void *)local_468,aStack_458._M_allocated_capacity + 1);
      }
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2e8,
                           (pVVar20->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      tcu::FloatFormat::convert((Interval *)local_468,&local_2b8,pIVar16);
      local_4a8.m_hi = (double)aStack_458._M_allocated_capacity;
      local_4a8._0_8_ = local_468;
      uVar12 = local_4a8._0_8_;
      local_4a8.m_lo = (double)auStack_460;
      fVar1 = local_280.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22];
      dVar24 = (double)fVar1;
      dVar25 = dVar24;
      if (NAN(fVar1)) {
        dVar25 = INFINITY;
        dVar24 = -INFINITY;
      }
      IVar19 = (IVal)(dVar24 <= (double)aStack_458._M_allocated_capacity &&
                     (double)auStack_460 <= dVar25);
      if ((NAN(fVar1)) &&
         (dVar24 <= (double)aStack_458._M_allocated_capacity && (double)auStack_460 <= dVar25)) {
        local_4a8.m_hasNaN = local_468[0];
        IVar19 = (IVal)local_4a8.m_hasNaN;
      }
      local_468 = (undefined1  [8])(auStack_460 + 8);
      local_4a8._0_8_ = uVar12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar9 = tcu::ResultCollector::check(local_490,(bool)((byte)IVar19 & 1),(string *)local_468);
      if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
        operator_delete((void *)local_468,aStack_458._M_allocated_capacity + 1);
      }
      pVVar20 = local_520;
      if ((!bVar8 || !bVar9) &&
         (uVar11 = (int)local_4b8 + 1, local_4b8 = (ulong)uVar11, (int)uVar11 < 0x65)) {
        local_468 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\t",1);
        pVVar4 = (pVVar20->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_1d8[0]._M_dataplus._M_p,
                   local_1d8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," = ",3);
        valueToString<float>
                  ((string *)local_4f8,&local_2b8,
                   (float *)((long)(local_4b0->in0).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar21));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,(char *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                   (long)local_4f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4f8._1_7_,local_4f8[0]) != &aStack_4e8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                          (ulong)(aStack_4e8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
          operator_delete(local_1d8[0]._M_dataplus._M_p,
                          local_1d8[0].field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\t",1);
        pVVar4 = (pVVar20->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_1d8[0]._M_dataplus._M_p,
                   local_1d8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," = ",3);
        valueToString<float>
                  ((string *)local_4f8,&local_2b8,
                   (float *)((long)local_280.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar21));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,(char *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                   (long)local_4f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,"\tExpected range: ",0x11);
        intervalToString<float>(&local_518,&local_2b8,&local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4f8._1_7_,local_4f8[0]) != &aStack_4e8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                          (ulong)(aStack_4e8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
          operator_delete(local_1d8[0]._M_dataplus._M_p,
                          local_1d8[0].field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\t",1);
        pVVar6 = (pVVar20->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<int>_>.m_ptr;
        local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
        pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_1d8[0]._M_dataplus._M_p,
                   local_1d8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," = ",3);
        valueToString<int>((string *)local_4f8,&local_2b8,
                           (int *)((long)local_280.out1.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar21));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,(char *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                   (long)local_4f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,"\tExpected range: ",0x11);
        intervalToString<int>(&local_518,&local_2b8,&local_488);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4f8._1_7_,local_4f8[0]) != &aStack_4e8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4f8._1_7_,local_4f8[0]),
                          (ulong)(aStack_4e8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
          operator_delete(local_1d8[0]._M_dataplus._M_p,
                          local_1d8[0].field_2._M_allocated_capacity + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
        std::ios_base::~ios_base(local_3f0);
      }
      uVar22 = uVar22 + 1;
      lVar21 = lVar21 + 4;
    } while (local_290 != uVar22);
    iVar10 = (int)local_4b8;
    if (iVar10 < 0x65) {
      if (iVar10 == 0) goto LAB_017d7cd7;
    }
    else {
      local_468 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)auStack_460,iVar10 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
      std::ios_base::~ios_base(local_3f0);
    }
    local_468 = (undefined1  [8])((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
    std::ostream::operator<<((ostringstream *)auStack_460,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
  std::ios_base::~ios_base(local_3f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_p != &local_1e8) {
    operator_delete(local_1f8._M_p,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_p != &local_208) {
    operator_delete(local_218._M_p,
                    CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_250 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_250 + 8));
  if (local_280.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_280.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_280.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_280.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_280.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}